

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O0

void __thiscall DStrifeStatusBar::DrawFullScreenStuff(DStrifeStatusBar *this)

{
  DFrameBuffer *pDVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 uVar5;
  FTexture *pFVar6;
  AInventory *pAVar7;
  undefined8 uVar8;
  AInventory *local_58;
  AInventory *item;
  int i;
  FTexture *cursor;
  int local_38;
  int local_34;
  int ammocount2;
  int ammocount1;
  AAmmo *ammo2;
  AAmmo *ammo1;
  ABasicArmor *local_18;
  ABasicArmor *armor;
  DStrifeStatusBar *this_local;
  
  armor = (ABasicArmor *)this;
  DBaseStatusBar::DrINumberOuter
            (&this->super_DBaseStatusBar,((this->super_DBaseStatusBar).CPlayer)->health,4,-10,false,
             7);
  pDVar1 = screen;
  pFVar6 = FImageCollection::operator[](&this->Images,0x1f);
  DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar6,14.0,-17.0,0x400013a6,0,0x4000139e,1,0);
  local_18 = AActor::FindInventory<ABasicArmor>
                       (&((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor);
  if ((local_18 != (ABasicArmor *)0x0) && ((local_18->super_AArmor).super_AInventory.Amount != 0)) {
    DBaseStatusBar::DrINumberOuter
              (&this->super_DBaseStatusBar,(local_18->super_AArmor).super_AInventory.Amount,0x23,-10
               ,false,7);
    pDVar1 = screen;
    ammo1._4_4_ = (local_18->super_AArmor).super_AInventory.Icon.texnum;
    pFVar6 = FTextureManager::operator()(&TexMan,ammo1._4_4_,false);
    DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar6,45.0,-17.0,0x400013a6,0,0x4000139e,1,0);
  }
  DBaseStatusBar::GetCurrentAmmo
            (&this->super_DBaseStatusBar,&ammo2,(AAmmo **)&ammocount2,&local_34,&local_38);
  if (ammo2 != (AAmmo *)0x0) {
    DBaseStatusBar::DrINumberOuter
              (&this->super_DBaseStatusBar,(ammo2->super_AInventory).Amount,-0x17,-10,false,7);
    pDVar1 = screen;
    pFVar6 = FTextureManager::operator()
                       (&TexMan,(FTextureID)(ammo2->super_AInventory).Icon.texnum,false);
    DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar6,-14.0,-17.0,0x400013a6,0,0x4000139e,1,0);
    if ((_ammocount2 != (AAmmo *)0x0) && (ammo2 != _ammocount2)) {
      DBaseStatusBar::DrINumberOuter
                (&this->super_DBaseStatusBar,(_ammocount2->super_AInventory).Amount,-0x17,-0x30,
                 false,7);
      pDVar1 = screen;
      pFVar6 = FTextureManager::operator()
                         (&TexMan,(FTextureID)(_ammocount2->super_AInventory).Icon.texnum,false);
      DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar6,-14.0,-55.0,0x400013a6,0,0x4000139e,1,0);
    }
  }
  iVar3 = FIntCVar::operator_cast_to_int(&deathmatch);
  if (iVar3 != 0) {
    DBaseStatusBar::DrBNumberOuterFont
              (&this->super_DBaseStatusBar,((this->super_DBaseStatusBar).CPlayer)->fragcount,-0x2c,1
               ,3);
  }
  if (((this->super_DBaseStatusBar).CPlayer)->inventorytics == 0) {
    bVar2 = TObjPtr<AInventory>::operator!=
                      (&((this->super_DBaseStatusBar).CPlayer)->mo->InvSel,(AInventory *)0x0);
    if (bVar2) {
      if (0.0 < this->ItemFlash) {
        pFVar6 = FImageCollection::operator[](&this->Images,this->CursorImage);
        pDVar1 = screen;
        uVar4 = FTexture::GetWidth(pFVar6);
        iVar3 = FTexture::GetHeight(pFVar6);
        DCanvas::DrawTexture
                  ((DCanvas *)pDVar1,pFVar6,-28.0,-15.0,0x400013a6,this->ItemFlash,0,0x4000139c,
                   (ulong)uVar4,0x4000139b,iVar3,0x4000138c,0);
      }
      pAVar7 = TObjPtr<AInventory>::operator->(&((this->super_DBaseStatusBar).CPlayer)->mo->InvSel);
      DBaseStatusBar::DrINumberOuter(&this->super_DBaseStatusBar,pAVar7->Amount,-0x33,-10,false,7);
      pDVar1 = screen;
      pAVar7 = TObjPtr<AInventory>::operator->(&((this->super_DBaseStatusBar).CPlayer)->mo->InvSel);
      pFVar6 = FTextureManager::operator()(&TexMan,(FTextureID)(pAVar7->Icon).texnum,false);
      pAVar7 = TObjPtr<AInventory>::operator->(&((this->super_DBaseStatusBar).CPlayer)->mo->InvSel);
      uVar5 = 0xaa000000;
      if (0 < pAVar7->Amount) {
        uVar5 = 0;
      }
      DCanvas::DrawTexture
                ((DCanvas *)pDVar1,pFVar6,-42.0,-17.0,0x400013a6,0,0x4000139e,1,0x400013aa,uVar5,0);
    }
  }
  else {
    pAVar7 = DBaseStatusBar::ValidateInvFirst(&this->super_DBaseStatusBar,6);
    TObjPtr<AInventory>::operator=(&((this->super_DBaseStatusBar).CPlayer)->mo->InvFirst,pAVar7);
    item._0_4_ = 0;
    bVar2 = TObjPtr<AInventory>::operator!=
                      (&((this->super_DBaseStatusBar).CPlayer)->mo->InvFirst,(AInventory *)0x0);
    if (bVar2) {
      local_58 = ::TObjPtr::operator_cast_to_AInventory_
                           ((TObjPtr *)&((this->super_DBaseStatusBar).CPlayer)->mo->InvFirst);
      for (; local_58 != (AInventory *)0x0 && (int)item < 6; item._0_4_ = (int)item + 1) {
        pAVar7 = ::TObjPtr::operator_cast_to_AInventory_
                           ((TObjPtr *)&((this->super_DBaseStatusBar).CPlayer)->mo->InvSel);
        pDVar1 = screen;
        if (local_58 == pAVar7) {
          pFVar6 = FImageCollection::operator[](&this->Images,this->CursorImage);
          DCanvas::DrawTexture
                    ((DCanvas *)pDVar1,pFVar6,(double)((int)item * 0x23 + -100),-21.0,0x400013a6,1,
                     0x4000138b,0xc000,0);
        }
        bVar2 = FTextureID::isValid(&local_58->Icon);
        pDVar1 = screen;
        if (bVar2) {
          pFVar6 = FTextureManager::operator()(&TexMan,(FTextureID)(local_58->Icon).texnum,false);
          pAVar7 = TObjPtr<AInventory>::operator->
                             (&((this->super_DBaseStatusBar).CPlayer)->mo->InvSel);
          uVar8 = 0xaa000000;
          if (0 < pAVar7->Amount) {
            uVar8 = 0;
          }
          DCanvas::DrawTexture
                    ((DCanvas *)pDVar1,pFVar6,(double)((int)item * 0x23 + -0x5e),-19.0,0x400013a6,1,
                     0x400013aa,uVar8,0);
        }
        DBaseStatusBar::DrINumberOuter
                  (&this->super_DBaseStatusBar,local_58->Amount,(int)item * 0x23 + -0x59,-10,true,7)
        ;
        local_58 = AInventory::NextInv(local_58);
      }
    }
  }
  return;
}

Assistant:

void DrawFullScreenStuff ()
	{
		// Draw health
		DrINumberOuter (CPlayer->health, 4, -10, false, 7);
		screen->DrawTexture (Images[imgMEDI], 14, -17,
			DTA_HUDRules, HUD_Normal,
			DTA_CenterBottomOffset, true,
			TAG_DONE);

		// Draw armor
		ABasicArmor *armor = CPlayer->mo->FindInventory<ABasicArmor>();
		if (armor != NULL && armor->Amount != 0)
		{
			DrINumberOuter (armor->Amount, 35, -10, false, 7);
			screen->DrawTexture (TexMan(armor->Icon), 45, -17,
				DTA_HUDRules, HUD_Normal,
				DTA_CenterBottomOffset, true,
				TAG_DONE);
		}

		// Draw ammo
		AAmmo *ammo1, *ammo2;
		int ammocount1, ammocount2;

		GetCurrentAmmo (ammo1, ammo2, ammocount1, ammocount2);
		if (ammo1 != NULL)
		{
			// Draw primary ammo in the bottom-right corner
			DrINumberOuter (ammo1->Amount, -23, -10, false, 7);
			screen->DrawTexture (TexMan(ammo1->Icon), -14, -17,
				DTA_HUDRules, HUD_Normal,
				DTA_CenterBottomOffset, true,
				TAG_DONE);
			if (ammo2 != NULL && ammo1!=ammo2)
			{
				// Draw secondary ammo just above the primary ammo
				DrINumberOuter (ammo2->Amount, -23, -48, false, 7);
				screen->DrawTexture (TexMan(ammo2->Icon), -14, -55,
					DTA_HUDRules, HUD_Normal,
					DTA_CenterBottomOffset, true,
					TAG_DONE);
			}
		}

		if (deathmatch)
		{ // Draw frags (in DM)
			DrBNumberOuterFont (CPlayer->fragcount, -44, 1);
		}

		// Draw inventory
		if (CPlayer->inventorytics == 0)
		{
			if (CPlayer->mo->InvSel != 0)
			{
				if (ItemFlash > 0)
				{
					FTexture *cursor = Images[CursorImage];
					screen->DrawTexture (cursor, -28, -15,
						DTA_HUDRules, HUD_Normal,
						DTA_LeftOffset, cursor->GetWidth(),
						DTA_TopOffset, cursor->GetHeight(),
						DTA_AlphaF, ItemFlash,
						TAG_DONE);
				}
				DrINumberOuter (CPlayer->mo->InvSel->Amount, -51, -10, false, 7);
				screen->DrawTexture (TexMan(CPlayer->mo->InvSel->Icon), -42, -17,
					DTA_HUDRules, HUD_Normal,
					DTA_CenterBottomOffset, true,
					DTA_ColorOverlay, CPlayer->mo->InvSel->Amount > 0 ? 0 : DIM_OVERLAY,
					TAG_DONE);
			}
		}
		else
		{
			CPlayer->mo->InvFirst = ValidateInvFirst (6);
			int i = 0;
			AInventory *item;
			if (CPlayer->mo->InvFirst != NULL)
			{
				for (item = CPlayer->mo->InvFirst; item != NULL && i < 6; item = item->NextInv(), ++i)
				{
					if (item == CPlayer->mo->InvSel)
					{
						screen->DrawTexture (Images[CursorImage], -100+i*35, -21,
							DTA_HUDRules, HUD_HorizCenter,
							DTA_Alpha, TRANSLUC75,
							TAG_DONE);
					}
					if (item->Icon.isValid())
					{
						screen->DrawTexture (TexMan(item->Icon), -94 + i*35, -19,
							DTA_HUDRules, HUD_HorizCenter,
							DTA_ColorOverlay, CPlayer->mo->InvSel->Amount > 0 ? 0 : DIM_OVERLAY,
							TAG_DONE);
					}
					DrINumberOuter (item->Amount, -89 + i*35, -10, true, 7);
				}
			}
		}
	}